

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.h
# Opt level: O3

int InitP33x(P33X *pP33x)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ssize_t sVar4;
  uchar m;
  char cVar5;
  uchar x;
  long lVar6;
  char *__s;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  uint8 writebuf [4];
  uint8 readbuf [10];
  byte local_2e [2];
  ushort local_2c;
  byte local_2a [8];
  char local_22;
  char local_21;
  
  local_2e[0] = 0xfa;
  local_2e[1] = 0x30;
  uVar3 = 0xffff;
  cVar5 = '\x02';
  lVar6 = 0;
  do {
    uVar3 = uVar3 ^ local_2e[lVar6];
    cVar7 = '\b';
    do {
      uVar8 = uVar3 >> 1;
      uVar2 = uVar3 & 1;
      uVar3 = uVar8 ^ 0xa001;
      if (uVar2 == 0) {
        uVar3 = uVar8;
      }
      cVar7 = cVar7 + -1;
    } while (cVar7 != '\0');
    lVar6 = lVar6 + 1;
    cVar5 = cVar5 + -1;
  } while (cVar5 != '\0');
  local_2c = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
  iVar1 = (pP33x->RS232Port).DevType;
  __s = "Error writing data to a P33x. ";
  if (iVar1 - 1U < 4) {
    iVar1 = (pP33x->RS232Port).s;
    uVar9 = 0;
    do {
      sVar4 = send(iVar1,local_2e + uVar9,(ulong)(4 - (int)uVar9),0);
      if ((int)sVar4 < 1) goto LAB_001b18ce;
      uVar3 = (int)uVar9 + (int)sVar4;
      uVar9 = (ulong)uVar3;
    } while ((int)uVar3 < 4);
  }
  else {
    if (iVar1 != 0) goto LAB_001b18ce;
    iVar1 = *(int *)&(pP33x->RS232Port).hDev;
    uVar9 = 0;
    do {
      sVar4 = write(iVar1,local_2e + uVar9,(ulong)(4 - (int)uVar9));
      if ((int)sVar4 < 1) goto LAB_001b18ce;
      uVar3 = (int)uVar9 + (int)sVar4;
      uVar9 = (ulong)uVar3;
    } while (uVar3 < 4);
  }
  iVar1 = (pP33x->RS232Port).DevType;
  __s = "Error reading data from a P33x. ";
  if (iVar1 - 1U < 4) {
    iVar1 = (pP33x->RS232Port).s;
    uVar9 = 0;
    do {
      sVar4 = recv(iVar1,local_2a + uVar9,(ulong)(4 - (int)uVar9),0);
      if ((int)sVar4 < 1) goto LAB_001b18ce;
      uVar3 = (int)uVar9 + (int)sVar4;
      uVar9 = (ulong)uVar3;
    } while ((int)uVar3 < 4);
  }
  else {
    if (iVar1 != 0) goto LAB_001b18ce;
    iVar1 = *(int *)&(pP33x->RS232Port).hDev;
    uVar9 = 0;
    do {
      sVar4 = read(iVar1,local_2a + uVar9,(ulong)(4 - (int)uVar9));
      if ((int)sVar4 < 1) goto LAB_001b18ce;
      uVar3 = (int)uVar9 + (int)sVar4;
      uVar9 = (ulong)uVar3;
    } while (uVar3 < 4);
  }
  iVar1 = (pP33x->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pP33x->RS232Port).s;
    uVar9 = 0;
    do {
      sVar4 = recv(iVar1,local_2a + uVar9,(ulong)(10 - (int)uVar9),0);
      if ((int)sVar4 < 1) goto LAB_001b18ce;
      uVar3 = (int)uVar9 + (int)sVar4;
      uVar9 = (ulong)uVar3;
    } while ((int)uVar3 < 10);
  }
  else {
    if (iVar1 != 0) goto LAB_001b18ce;
    iVar1 = *(int *)&(pP33x->RS232Port).hDev;
    uVar9 = 0;
    do {
      sVar4 = read(iVar1,local_2a + uVar9,(ulong)(10 - (int)uVar9));
      if ((int)sVar4 < 1) goto LAB_001b18ce;
      uVar3 = (int)uVar9 + (int)sVar4;
      uVar9 = (ulong)uVar3;
    } while (uVar3 < 10);
  }
  if (local_2a[0] == 0xfa) {
    if (local_2a[1] == '0') {
      uVar3 = 0xffff;
      cVar5 = '\b';
      lVar6 = 0;
      do {
        uVar3 = uVar3 ^ local_2a[lVar6];
        cVar7 = '\b';
        do {
          uVar8 = uVar3 >> 1;
          uVar2 = uVar3 & 1;
          uVar3 = uVar8 ^ 0xa001;
          if (uVar2 == 0) {
            uVar3 = uVar8;
          }
          cVar7 = cVar7 + -1;
        } while (cVar7 != '\0');
        lVar6 = lVar6 + 1;
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      __s = "Error reading data from a P33x : Bad CRC-16. ";
      if ((local_22 == (char)(uVar3 >> 8)) && (local_21 == (char)uVar3)) {
        return 0;
      }
    }
    else {
      __s = "Error reading data from a P33x : The device function failed. ";
    }
  }
  else {
    __s = "Error reading data from a P33x : Bad device address. ";
  }
LAB_001b18ce:
  puts(__s);
  return 1;
}

Assistant:

inline int InitP33x(P33X* pP33x)
{
	uint8 readbuf[10];
	uint8 writebuf[4];
	uint8 crc_h = 0;
	uint8 crc_l = 0;
	//int devclass = 0;
	//int group = 0;
	//int year = 0;
	//int week = 0;
	//int buf = 0;
	//int stat = 0;

	writebuf[0] = (uint8)0xfa; // device address = 250
	writebuf[1] = (uint8)0x30; // function 48
	CalcCRC16(writebuf, 4-2, &(writebuf[2]), &(writebuf[3])); // CRC-16

	if (WriteAllRS232Port(&pP33x->RS232Port, writebuf, 4) != EXIT_SUCCESS)
	{ 
		printf("Error writing data to a P33x. \n");
		return EXIT_FAILURE;
	}

	// Read the echo.
	if (ReadAllRS232Port(&pP33x->RS232Port, readbuf, 4) != EXIT_SUCCESS)
	{
		printf("Error reading data from a P33x. \n");
		return EXIT_FAILURE;
	}

	// Read the data.
	if (ReadAllRS232Port(&pP33x->RS232Port, readbuf, 10) != EXIT_SUCCESS)
	{ 
		printf("Error reading data from a P33x. \n");
		return EXIT_FAILURE;
	}

	// Device address = 250.
	if (readbuf[0] != (uint8)0xfa)
	{ 
		printf("Error reading data from a P33x : Bad device address. \n");
		return EXIT_FAILURE;	
	}

	// Function 48.
	if (readbuf[1] != (uint8)0x30)
	{ 
		printf("Error reading data from a P33x : The device function failed. \n");
		return EXIT_FAILURE;	
	}

	CalcCRC16(readbuf, 10-2, &crc_h, &crc_l);

	// CRC-16.
	if ((readbuf[8] != crc_h)||(readbuf[9] != crc_l))
	{ 
		printf("Error reading data from a P33x : Bad CRC-16. \n");
		return EXIT_FAILURE;	
	}

	//devclass = readbuf[2];
	//group = readbuf[3];
	//year = readbuf[4];
	//week = readbuf[5];
	//buf = readbuf[6];
	//stat = readbuf[7];

	//PRINT_DEBUG_MESSAGE_OSUTILS(("Device ID : %d.%d\n", devclass, group));
	//PRINT_DEBUG_MESSAGE_OSUTILS(("Firmware version : %d.%d\n", year, week));
	//PRINT_DEBUG_MESSAGE_OSUTILS(("Length of the internal receive buffer : %d\n", buf));
	//PRINT_DEBUG_MESSAGE_OSUTILS(("Status information : %d\n", stat));

	return EXIT_SUCCESS;
}